

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::AdvancedSwitchPrograms::Run(AdvancedSwitchPrograms *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  byte bVar8;
  float data [32];
  undefined1 local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  vec3 local_1d8;
  vec3 local_1c8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  bVar8 = 0;
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,1)
  ;
  lVar7 = 0x10;
  if (bVar1) {
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    lVar6 = 0;
    lVar7 = -1;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "\nstruct VertexData {\n  vec2 position;\n  vec3 color;\n};\nlayout(binding = ",
                 0x48);
      poVar3 = (ostream *)std::ostream::operator<<(local_1a8,(int)lVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,
                 ", std430) buffer Input {\n  VertexData vertex[];\n} g_vs_in;\nout StageData {\n  vec3 color;\n} g_vs_out;\nvoid main() {\n  gl_Position = vec4(g_vs_in.vertex[gl_VertexID].position, 0, 1);\n  g_vs_out.color = g_vs_in.vertex[gl_VertexID].color;\n}"
                 ,0xec);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      local_1b8._0_8_ = local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,
                 "\nin StageData {\n  vec3 color;\n} g_fs_in;\nlayout(location = 0) out vec4 g_fs_out;\nvoid main() {\n  g_fs_out = vec4(g_fs_in.color, 1);\n}"
                 ,"");
      GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                        (&this->super_ShaderStorageBufferObjectBase,(string *)local_1f8,
                         (string *)local_1b8);
      this->m_program[lVar6] = GVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ != local_1a8) {
        operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._0_8_ != &local_1e8) {
        operator_delete((void *)local_1f8._0_8_,local_1e8._M_allocated_capacity + 1);
      }
      glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[lVar6]);
      bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                        (&this->super_ShaderStorageBufferObjectBase,this->m_program[lVar6]);
      if (!bVar1) {
        return -1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    glu::CallLogWrapper::glGenBuffers(this_00,4,this->m_storage_buffer);
    puVar4 = &DAT_01a934d0;
    puVar5 = (undefined8 *)local_1b8;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[0]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x80,local_1b8,0x88e4);
    puVar4 = &DAT_01a93550;
    puVar5 = (undefined8 *)local_1b8;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x80,local_1b8,0x88e4);
    puVar4 = &DAT_01a935d0;
    puVar5 = (undefined8 *)local_1b8;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,2,this->m_storage_buffer[2]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x80,local_1b8,0x88e4);
    puVar4 = &DAT_01a93650;
    puVar5 = (undefined8 *)local_1b8;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,3,this->m_storage_buffer[3]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x80,local_1b8,0x88e4);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_rt);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2601);
    glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8058,100,100);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    glu::CallLogWrapper::glViewport(this_00,0,0,100,100);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->m_fbo);
    glu::CallLogWrapper::glFramebufferTexture(this_00,0x8d40,0x8ce0,this->m_rt,0);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    lVar6 = 10;
    do {
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program[lVar6 + -10]);
      glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0xe);
    local_1b8._0_8_ = (pointer)0x3f800000;
    local_1b8._8_4_ = 0.0;
    local_1f8._0_8_ = (pointer)0x3f80000000000000;
    local_1f8._8_4_ = 0.0;
    local_1c8.m_data._0_8_ = &DAT_3f8000003f800000;
    local_1c8.m_data[2] = 0.0;
    local_1d8.m_data[0] = 0.0;
    local_1d8.m_data[1] = 0.0;
    local_1d8.m_data[2] = 1.0;
    bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                      (&this->super_ShaderStorageBufferObjectBase,(vec3 *)local_1b8,
                       (vec3 *)local_1f8,&local_1c8,&local_1d8,(int *)0x0);
    if (bVar1) {
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glShaderStorageBlockBinding(this_00,this->m_program[0],0,3);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program[0]);
      glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
      local_1b8._8_4_ = 0.0;
      local_1b8._0_8_ = (pointer)0x0;
      local_1f8._8_4_ = 0.0;
      local_1f8._0_8_ = (pointer)0x0;
      local_1c8.m_data._0_8_ = &DAT_3f8000003f800000;
      local_1c8.m_data[2] = 0.0;
      local_1d8.m_data[2] = 0.0;
      local_1d8.m_data[0] = 0.0;
      local_1d8.m_data[1] = 0.0;
      bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                        (&this->super_ShaderStorageBufferObjectBase,(vec3 *)local_1b8,
                         (vec3 *)local_1f8,&local_1c8,&local_1d8,(int *)0x0);
      if (bVar1) {
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glShaderStorageBlockBinding(this_00,this->m_program[3],0,0);
        glu::CallLogWrapper::glUseProgram(this_00,this->m_program[3]);
        glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
        local_1b8._0_8_ = (pointer)0x3f800000;
        local_1b8._8_4_ = 0.0;
        local_1f8._8_4_ = 0.0;
        local_1f8._0_8_ = (pointer)0x0;
        local_1c8.m_data[2] = 0.0;
        local_1c8.m_data[0] = 0.0;
        local_1c8.m_data[1] = 0.0;
        local_1d8.m_data[2] = 0.0;
        local_1d8.m_data[0] = 0.0;
        local_1d8.m_data[1] = 0.0;
        bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                          (&this->super_ShaderStorageBufferObjectBase,(vec3 *)local_1b8,
                           (vec3 *)local_1f8,&local_1c8,&local_1d8,(int *)0x0);
        lVar7 = (ulong)bVar1 - 1;
      }
    }
  }
  return lVar7;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;

		const char* const glsl_fs =
			NL "in StageData {" NL "  vec3 color;" NL "} g_fs_in;" NL "layout(location = 0) out vec4 g_fs_out;" NL
			   "void main() {" NL "  g_fs_out = vec4(g_fs_in.color, 1);" NL "}";
		for (int i = 0; i < 4; ++i)
		{
			m_program[i] = CreateProgram(GenSource(i), glsl_fs);
			glLinkProgram(m_program[i]);
			if (!CheckProgram(m_program[i]))
				return ERROR;
		}

		glGenBuffers(4, m_storage_buffer);

		/* left, bottom, red quad */
		{
			const float data[] = { -0.4f - 0.5f, -0.4f - 0.5f, 0.0f, 0.0f, 1.0f, 0.0f, 0.0f, 0.0f,
								   0.4f - 0.5f,  -0.4f - 0.5f, 0.0f, 0.0f, 1.0f, 0.0f, 0.0f, 0.0f,
								   -0.4f - 0.5f, 0.4f - 0.5f,  0.0f, 0.0f, 1.0f, 0.0f, 0.0f, 0.0f,
								   0.4f - 0.5f,  0.4f - 0.5f,  0.0f, 0.0f, 1.0f, 0.0f, 0.0f, 0.0f };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		/* right, bottom, green quad */
		{
			const float data[] = { -0.4f + 0.5f, -0.4f - 0.5f, 0.0f, 0.0f, 0.0f, 1.0f, 0.0f, 0.0f,
								   0.4f + 0.5f,  -0.4f - 0.5f, 0.0f, 0.0f, 0.0f, 1.0f, 0.0f, 0.0f,
								   -0.4f + 0.5f, 0.4f - 0.5f,  0.0f, 0.0f, 0.0f, 1.0f, 0.0f, 0.0f,
								   0.4f + 0.5f,  0.4f - 0.5f,  0.0f, 0.0f, 0.0f, 1.0f, 0.0f, 0.0f };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		/* left, top, blue quad */
		{
			const float data[] = { -0.4f - 0.5f, -0.4f + 0.5f, 0.0f, 0.0f, 0.0f, 0.0f, 1.0f, 0.0f,
								   0.4f - 0.5f,  -0.4f + 0.5f, 0.0f, 0.0f, 0.0f, 0.0f, 1.0f, 0.0f,
								   -0.4f - 0.5f, 0.4f + 0.5f,  0.0f, 0.0f, 0.0f, 0.0f, 1.0f, 0.0f,
								   0.4f - 0.5f,  0.4f + 0.5f,  0.0f, 0.0f, 0.0f, 0.0f, 1.0f, 0.0f };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		/* right, top, yellow quad */
		{
			const float data[] = { -0.4f + 0.5f, -0.4f + 0.5f, 0.0f, 0.0f, 1.0f, 1.0f, 0.0f, 0.0f,
								   0.4f + 0.5f,  -0.4f + 0.5f, 0.0f, 0.0f, 1.0f, 1.0f, 0.0f, 0.0f,
								   -0.4f + 0.5f, 0.4f + 0.5f,  0.0f, 0.0f, 1.0f, 1.0f, 0.0f, 0.0f,
								   0.4f + 0.5f,  0.4f + 0.5f,  0.0f, 0.0f, 1.0f, 1.0f, 0.0f, 0.0f };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}

		glBindTexture(GL_TEXTURE_2D, m_rt);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 100, 100);
		glBindTexture(GL_TEXTURE_2D, 0);
		glViewport(0, 0, 100, 100);
		glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_rt, 0);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);

		glClear(GL_COLOR_BUFFER_BIT);
		for (int i = 0; i < 4; ++i)
		{
			glUseProgram(m_program[i]);
			glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		}
		if (!ValidateWindow4Quads(vec3(1, 0, 0), vec3(0, 1, 0), vec3(1, 1, 0), vec3(0, 0, 1)))
		{
			return ERROR;
		}

		glClear(GL_COLOR_BUFFER_BIT);
		glShaderStorageBlockBinding(m_program[0], 0, 3);
		glUseProgram(m_program[0]);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		if (!ValidateWindow4Quads(vec3(0), vec3(0), vec3(1, 1, 0), vec3(0)))
		{
			return ERROR;
		}

		glClear(GL_COLOR_BUFFER_BIT);
		glShaderStorageBlockBinding(m_program[3], 0, 0);
		glUseProgram(m_program[3]);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		if (!ValidateWindow4Quads(vec3(1, 0, 0), vec3(0), vec3(0), vec3(0)))
		{
			return ERROR;
		}

		return NO_ERROR;
	}